

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O1

int run_test_pipe_connect_close_multiple(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_pipe_t *puVar3;
  int iVar4;
  long *plVar5;
  code **ppcVar6;
  long lVar7;
  client_t *unaff_R14;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_68 [2];
  undefined8 uStack_58;
  long lStack_50;
  undefined8 uStack_48;
  client_t *pcStack_40;
  long local_38;
  long local_30;
  
  iVar4 = (int)&local_38;
  pcStack_40 = (client_t *)0x1b14a4;
  uVar2 = uv_default_loop();
  pcStack_40 = (client_t *)0x1b14b8;
  iVar1 = uv_pipe_init(uVar2,&server_handle,0);
  local_30 = (long)iVar1;
  local_38 = 0;
  if (local_30 == 0) {
    pcStack_40 = (client_t *)0x1b14e9;
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b1685;
    pcStack_40 = (client_t *)0x1b151f;
    iVar1 = uv_listen(&server_handle,0x80,connection_cb2);
    local_30 = (long)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b1692;
    unaff_R14 = clients;
    lVar7 = 10;
    local_30 = 0;
    do {
      pcStack_40 = (client_t *)0x1b1565;
      iVar1 = uv_pipe_init(uVar2,unaff_R14,0);
      local_30 = (long)iVar1;
      local_38 = 0;
      if (local_30 != 0) {
        pcStack_40 = (client_t *)0x1b1678;
        run_test_pipe_connect_close_multiple_cold_4();
        goto LAB_001b1678;
      }
      pcStack_40 = (client_t *)0x1b1598;
      uv_pipe_connect(&unaff_R14->conn_req,unaff_R14,"/tmp/uv-test-sock",connect_cb2);
      unaff_R14 = unaff_R14 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    lVar7 = 0;
    do {
      pcStack_40 = (client_t *)0x1b15b9;
      uv_close((long)&clients[0].pipe_handle.data + lVar7,0);
      lVar7 = lVar7 + 0x150;
    } while (lVar7 != 0xd20);
    pcStack_40 = (client_t *)0x1b15d3;
    uv_run(uVar2,0);
    local_30 = (long)connection_cb_called;
    local_38 = 10;
    unaff_R14 = (client_t *)0xd20;
    if (local_30 != 10) goto LAB_001b169f;
    local_30 = (long)connect_cb_called;
    local_38 = 10;
    if (local_30 != 10) goto LAB_001b16ac;
    pcStack_40 = (client_t *)0x1b162a;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_40 = (client_t *)0x1b1634;
    uv_run(uVar2,0);
    local_30 = 0;
    pcStack_40 = (client_t *)0x1b1645;
    iVar1 = uv_loop_close(uVar2);
    local_38 = (long)iVar1;
    if (local_30 == local_38) {
      pcStack_40 = (client_t *)0x1b165b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001b1678:
    pcStack_40 = (client_t *)0x1b1685;
    run_test_pipe_connect_close_multiple_cold_1();
LAB_001b1685:
    pcStack_40 = (client_t *)0x1b1692;
    run_test_pipe_connect_close_multiple_cold_2();
LAB_001b1692:
    pcStack_40 = (client_t *)0x1b169f;
    run_test_pipe_connect_close_multiple_cold_3();
LAB_001b169f:
    pcStack_40 = (client_t *)0x1b16ac;
    run_test_pipe_connect_close_multiple_cold_5();
LAB_001b16ac:
    pcStack_40 = (client_t *)0x1b16b9;
    run_test_pipe_connect_close_multiple_cold_6();
  }
  plVar5 = &local_30;
  pcStack_40 = (client_t *)connection_cb2;
  run_test_pipe_connect_close_multiple_cold_7();
  lStack_50 = (long)iVar4;
  uStack_58 = 0;
  uStack_48 = uVar2;
  pcStack_40 = unaff_R14;
  if (lStack_50 == 0) {
    puVar3 = connections + connection_cb_called;
    apcStack_68[0] = (code *)0x1b1717;
    iVar1 = uv_pipe_init(plVar5[1],puVar3,0);
    lStack_50 = (long)iVar1;
    uStack_58 = 0;
    if (lStack_50 == 0) {
      apcStack_68[0] = (code *)0x1b173e;
      iVar1 = uv_accept(plVar5,puVar3);
      lStack_50 = (long)iVar1;
      uStack_58 = 0;
      if (lStack_50 == 0) {
        apcStack_68[0] = (code *)0x1b1764;
        uv_close(puVar3,0);
        connection_cb_called = connection_cb_called + 1;
        if ((connection_cb_called == 10) && (connect_cb_called == 10)) {
          iVar1 = uv_close(&server_handle,0);
          return iVar1;
        }
        return connection_cb_called;
      }
      goto LAB_001b17bb;
    }
  }
  else {
    apcStack_68[0] = (code *)0x1b17ac;
    connection_cb2_cold_1();
  }
  apcStack_68[0] = (code *)0x1b17bb;
  connection_cb2_cold_2();
LAB_001b17bb:
  iVar1 = (int)&uStack_58;
  apcStack_68[0] = connect_cb2;
  connection_cb2_cold_3();
  apcStack_68[0] = (code *)(long)iVar1;
  if (apcStack_68[0] != (code *)0xffffffffffffff83) {
    ppcVar6 = apcStack_68;
    connect_cb2_cold_1();
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv_close(ppcVar6,0);
    return iVar1;
  }
  connect_cb_called = connect_cb_called + 1;
  if ((connect_cb_called == 10) && (connection_cb_called == 10)) {
    iVar1 = uv_close(&server_handle,0);
    return iVar1;
  }
  return connect_cb_called;
}

Assistant:

TEST_IMPL(pipe_connect_close_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb2);
  ASSERT_OK(r);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT_OK(r);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb2);
  }

  for (i = 0; i < NUM_CLIENTS; i++) {
    uv_close((uv_handle_t*)&clients[i].pipe_handle, NULL);
  }


  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(connection_cb_called, NUM_CLIENTS);
  ASSERT_EQ(connect_cb_called, NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}